

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

int wally_ec_public_key_verify(uchar *pub_key,size_t pub_key_len)

{
  int iVar1;
  int iVar2;
  secp256k1_pubkey_conflict pub;
  
  iVar2 = -2;
  if ((pub_key != (uchar *)0x0) && ((pub_key_len == 0x41 || (pub_key_len == 0x21)))) {
    iVar1 = pubkey_parse(&pub,pub_key,pub_key_len);
    if (iVar1 != 0) {
      wally_clear(&pub,0x40);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int wally_ec_public_key_verify(const unsigned char *pub_key, size_t pub_key_len)
{
    secp256k1_pubkey pub;

    if (!pub_key ||
        !(pub_key_len == EC_PUBLIC_KEY_LEN || pub_key_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN) ||
        !pubkey_parse(&pub, pub_key, pub_key_len))
        return WALLY_EINVAL;

    wally_clear(&pub, sizeof(pub));
    return WALLY_OK;
}